

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::ResourceBuffer::ResourceBuffer
          (ResourceBuffer *this,ifstream *ifs,uint32_t offset,uint32_t size)

{
  ifstream *piVar1;
  char *pcVar2;
  char *pcVar3;
  vector<char,_std::allocator<char>_> *this_00;
  fpos<__mbstate_t> local_40 [2];
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t size_local;
  uint32_t offset_local;
  ifstream *ifs_local;
  ResourceBuffer *this_local;
  
  local_20 = size;
  local_1c = offset;
  _size_local = ifs;
  ifs_local = (ifstream *)this;
  std::streambuf::streambuf(this);
  *(undefined ***)this = &PTR__ResourceBuffer_0018b7d8;
  std::vector<char,_std::allocator<char>_>::vector(&this->vMemory);
  std::vector<char,_std::allocator<char>_>::resize(&this->vMemory,(ulong)local_20);
  piVar1 = _size_local;
  std::fpos<__mbstate_t>::fpos(local_40,(ulong)local_1c);
  std::istream::seekg(piVar1,local_40[0]._M_off,local_40[0]._M_state);
  piVar1 = _size_local;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->vMemory);
  std::vector<char,_std::allocator<char>_>::size(&this->vMemory);
  std::istream::read((char *)piVar1,(long)pcVar2);
  this_00 = &this->vMemory;
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(this_00);
  pcVar3 = std::vector<char,_std::allocator<char>_>::data(this_00);
  std::vector<char,_std::allocator<char>_>::data(this_00);
  std::streambuf::setg((char *)this,pcVar2,pcVar3);
  return;
}

Assistant:

ResourceBuffer::ResourceBuffer(std::ifstream &ifs, uint32_t offset, uint32_t size)
	{
		vMemory.resize(size);
		ifs.seekg(offset);
		ifs.read(vMemory.data(), vMemory.size());
		setg(vMemory.data(), vMemory.data(), vMemory.data() + size);
	}